

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_x86_avx2.cpp
# Opt level: O3

void __thiscall
ncnn::ConvolutionDepthWise_x86_avx2::ConvolutionDepthWise_x86_avx2
          (ConvolutionDepthWise_x86_avx2 *this)

{
  undefined1 auVar1 [32];
  
  ConvolutionDepthWise::ConvolutionDepthWise((ConvolutionDepthWise *)&this->field_0xb8);
  this->_vptr_ConvolutionDepthWise_x86_avx2 = (_func_int **)0x3637e0;
  *(undefined8 *)&this->field_0xb8 = 0x363868;
  (this->weight_data_packed).allocator = (Allocator *)0x0;
  (this->weight_data_packed).dims = 0;
  (this->weight_data_packed).w = 0;
  (this->weight_data_packed).w = 0;
  (this->weight_data_packed).h = 0;
  (this->weight_data_packed).d = 0;
  (this->weight_data_packed).c = 0;
  (this->weight_data_int8).cstep = 0;
  (this->weight_data_int8).allocator = (Allocator *)0x0;
  (this->weight_data_int8).dims = 0;
  (this->weight_data_int8).w = 0;
  (this->weight_data_int8).w = 0;
  (this->weight_data_int8).h = 0;
  (this->weight_data_int8).d = 0;
  (this->weight_data_int8).c = 0;
  auVar1 = ZEXT432(0) << 0x40;
  this->group_ops = (vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)auVar1._0_24_;
  (this->weight_data_packed).data = (void *)auVar1._24_8_;
  *(undefined1 (*) [32])
   ((long)&(this->group_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage + 4) = auVar1;
  *(undefined1 (*) [32])&(this->weight_data_packed).cstep = ZEXT432(0) << 0x40;
  (this->weight_data_int8).elempack = 0;
  this->field_0xc3 = 1;
  this->field_0xc9 = 1;
  this->activation = (Layer *)0x0;
  return;
}

Assistant:

ConvolutionDepthWise_x86_avx2::ConvolutionDepthWise_x86_avx2()
{
#if __SSE2__
    support_packing = true;
#if __AVX2__
    support_weight_fp16_storage = true;
#endif
#endif // __SSE2__
    activation = 0;
}